

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLiSample> * __thiscall
pbrt::UniformInfiniteLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,UniformInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  SampledSpectrum SVar18;
  undefined1 auVar12 [56];
  undefined1 auVar15 [56];
  
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  if (mode == WithMIS) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar10._0_16_,
                             SUB6416(ZEXT464(0x3f800000),0));
    auVar9 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar5,auVar5);
    auVar15 = SUB6456(ZEXT864(0),0);
    auVar9 = vmaxss_avx(auVar9,ZEXT816(0) << 0x40);
    if (auVar9._0_4_ < 0.0) {
      fVar6 = sqrtf(auVar9._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar6 = auVar9._0_4_;
    }
    auVar9 = vmovshdup_avx(auVar10._0_16_);
    fVar4 = auVar9._0_4_ * 6.2831855;
    fVar7 = cosf(fVar4);
    fVar8 = sinf(fVar4);
    fVar4 = this->scale;
    auVar9._4_4_ = fVar4;
    auVar9._0_4_ = fVar4;
    auVar9._8_4_ = fVar4;
    auVar9._12_4_ = fVar4;
    auVar12 = ZEXT856(auVar9._8_8_);
    SVar18 = DenselySampledSpectrum::Sample(&this->Lemit,&lambda);
    auVar14._0_8_ = SVar18.values.values._8_8_;
    auVar14._8_56_ = auVar15;
    auVar11._0_8_ = SVar18.values.values._0_8_;
    auVar11._8_56_ = auVar12;
    auVar3 = vmovlhps_avx(auVar11._0_16_,auVar14._0_16_);
    auVar9 = vinsertps_avx(ZEXT416((uint)(fVar7 * fVar6)),ZEXT416((uint)(fVar8 * fVar6)),0x10);
    fVar2 = this->sceneRadius + this->sceneRadius;
    fVar7 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
            ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) *
            0.5 + fVar7 * fVar6 * fVar2;
    fVar6 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
            ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) *
            0.5 + fVar8 * fVar6 * fVar2;
    fVar2 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
            0.5 + auVar5._0_4_ * fVar2;
    auVar16._4_4_ = fVar7;
    auVar16._0_4_ = fVar7;
    auVar16._8_4_ = fVar7;
    auVar16._12_4_ = fVar7;
    auVar13._4_4_ = fVar6;
    auVar13._0_4_ = fVar6;
    auVar13._8_4_ = fVar6;
    auVar13._12_4_ = fVar6;
    auVar13 = vmovlhps_avx(auVar16,auVar13);
    auVar17._4_4_ = fVar2;
    auVar17._0_4_ = fVar2;
    auVar17._8_4_ = fVar2;
    auVar17._12_4_ = fVar2;
    *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) =
         ZEXT1232(ZEXT812(0));
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    __return_storage_ptr__->set = true;
    *(float *)&__return_storage_ptr__->optionalValue = auVar3._0_4_ * fVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = auVar3._4_4_ * fVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = auVar3._8_4_ * fVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = auVar3._12_4_ * fVar4;
    uVar1 = vmovlps_avx(auVar9);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar5._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3da2f983;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar13;
    uVar1 = vmovlps_avx(auVar17);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         &(this->super_LightBase).mediumInterface;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> UniformInfiniteLight::SampleLi(
    LightSampleContext ctx, Point2f u, SampledWavelengths lambda,
    LightSamplingMode mode) const {
    if (mode == LightSamplingMode::WithMIS)
        return {};
    // Return uniform spherical sample for uniform infinite light
    Vector3f wi = SampleUniformSphere(u);
    Float pdf = UniformSpherePDF();
    return LightLiSample(scale * Lemit.Sample(lambda), wi, pdf,
                         Interaction(ctx.p() + wi * (2 * sceneRadius), &mediumInterface));
}